

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O2

bool __thiscall
NNTreeIterator::deepen(NNTreeIterator *this,QPDFObjectHandle *node,bool first,bool allow_empty)

{
  list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_> *__x;
  QPDFObjectHandle *oh;
  QPDF *pQVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  QPDFObjGen QVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined7 in_register_00000009;
  iterator __end1;
  _List_node_base *p_Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined4 local_10c;
  QPDF *local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  QPDFObjectHandle next;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_c8;
  string local_b8;
  QPDFObjectHandle items;
  QPDFObjectHandle kids;
  list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_> opath;
  set seen;
  
  local_10c = (undefined4)CONCAT71(in_register_00000009,allow_empty);
  __x = &this->path;
  std::__cxx11::list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::
  list(&opath,__x);
  seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
  super__Rb_tree_header._M_header._M_left =
       &seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
        super__Rb_tree_header._M_header;
  seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
  super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  p_Var7 = (_List_node_base *)__x;
  seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
  super__Rb_tree_header._M_header._M_right =
       seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
       super__Rb_tree_header._M_header._M_left;
  while (p_Var7 = (((_List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                     *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var7 != (_List_node_base *)__x) {
    QVar6 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)(p_Var7 + 1));
    QPDFObjGen::set::add(&seen,QVar6);
  }
  bVar2 = false;
  do {
    if (bVar2) goto LAB_0013588e;
    QVar6 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen(&node->super_BaseHandle);
    bVar3 = QPDFObjGen::set::add(&seen,QVar6);
    if (!bVar3) {
      pQVar1 = this->impl->qpdf;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"loop detected while traversing name/number tree",
                 (allocator<char> *)&local_100);
      warn(pQVar1,node,&local_130);
LAB_00135884:
      std::__cxx11::string::~string((string *)&local_130);
      goto LAB_0013588e;
    }
    bVar3 = QPDFObjectHandle::isDictionary(node);
    if (!bVar3) {
      pQVar1 = this->impl->qpdf;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"non-dictionary node while traversing name/number tree",
                 (allocator<char> *)&local_100);
      warn(pQVar1,node,&local_130);
      goto LAB_00135884;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"/Kids",(allocator<char> *)&local_100);
    QPDFObjectHandle::getKey(&kids,(string *)node);
    std::__cxx11::string::~string((string *)&local_130);
    bVar3 = QPDFObjectHandle::isArray(&kids);
    iVar4 = 0;
    if (bVar3) {
      iVar4 = QPDFObjectHandle::getArrayNItems(&kids);
    }
    (*(code *)**(undefined8 **)this->impl->details)();
    QPDFObjectHandle::getKey(&items,(string *)node);
    bVar3 = QPDFObjectHandle::isArray(&items);
    if ((bVar3) && (iVar5 = QPDFObjectHandle::getArrayNItems(&items), 0 < iVar5)) {
      iVar5 = iVar5 + -2;
      if (first) {
        iVar5 = 0;
      }
LAB_00135579:
      setItemNumber(this,node,iVar5);
LAB_00135755:
      bVar3 = false;
    }
    else {
      if (iVar4 < 1) {
        if ((char)local_10c != '\0') {
          bVar3 = QPDFObjectHandle::isArray(&items);
          iVar5 = -1;
          if (bVar3) goto LAB_00135579;
        }
        pQVar1 = this->impl->qpdf;
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (*(code *)**(undefined8 **)this->impl->details)();
        std::operator+(&local_100,"name/number tree node has neither non-empty ",__rhs);
        std::operator+(&local_130,&local_100," nor /Kids");
        warn(pQVar1,node,&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_100);
        bVar2 = true;
        goto LAB_00135755;
      }
      iVar4 = iVar4 + -1;
      if (first) {
        iVar4 = 0;
      }
      addPathElement(this,node,iVar4);
      QPDFObjectHandle::getArrayItem(&next,(int)&kids);
      bVar3 = QPDFObjectHandle::isIndirect(&next);
      if (!bVar3) {
        local_108 = this->impl->qpdf;
        if (this->impl->auto_repair == true) {
          std::__cxx11::to_string(&local_b8,iVar4);
          std::operator+(&local_100,"converting kid number ",&local_b8);
          std::operator+(&local_130,&local_100," to an indirect object");
          warn(local_108,node,&local_130);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::~string((string *)&local_100);
          std::__cxx11::string::~string((string *)&local_b8);
          oh = (QPDFObjectHandle *)this->impl->qpdf;
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_c8,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&next);
          QPDF::makeIndirectObject((QPDF *)&local_130,oh);
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&next,
                     (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_130);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_130._M_string_length);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
          QPDFObjectHandle::setArrayItem(&kids,iVar4,&next);
        }
        else {
          std::__cxx11::to_string(&local_b8,iVar4);
          std::operator+(&local_100,"kid number ",&local_b8);
          std::operator+(&local_130,&local_100," is not an indirect object");
          warn(local_108,node,&local_130);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::~string((string *)&local_100);
          std::__cxx11::string::~string((string *)&local_b8);
        }
      }
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)node,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&next);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&next.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      bVar3 = true;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&items.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  } while (bVar3);
  bVar3 = true;
  if (bVar2) {
LAB_0013588e:
    std::__cxx11::list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::
    operator=(__x,&opath);
    bVar3 = false;
  }
  std::
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  ::~_Rb_tree((_Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
               *)&seen);
  std::__cxx11::
  _List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::_M_clear
            (&opath.
              super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
            );
  return bVar3;
}

Assistant:

bool
NNTreeIterator::deepen(QPDFObjectHandle node, bool first, bool allow_empty)
{
    // Starting at this node, descend through the first or last kid until we reach a node with
    // items. If we succeed, return true; otherwise return false and leave path alone.

    auto opath = this->path;
    bool failed = false;

    QPDFObjGen::set seen;
    for (auto const& i: this->path) {
        seen.add(i.node);
    }
    while (!failed) {
        if (!seen.add(node)) {
            QTC::TC("qpdf", "NNTree deepen: loop");
            warn(impl.qpdf, node, "loop detected while traversing name/number tree");
            failed = true;
            break;
        }

        if (!node.isDictionary()) {
            QTC::TC("qpdf", "NNTree node is not a dictionary");
            warn(impl.qpdf, node, "non-dictionary node while traversing name/number tree");
            failed = true;
            break;
        }

        auto kids = node.getKey("/Kids");
        int nkids = kids.isArray() ? kids.getArrayNItems() : 0;
        auto items = node.getKey(impl.details.itemsKey());
        int nitems = items.isArray() ? items.getArrayNItems() : 0;
        if (nitems > 0) {
            setItemNumber(node, first ? 0 : nitems - 2);
            break;
        } else if (nkids > 0) {
            int kid_number = first ? 0 : nkids - 1;
            addPathElement(node, kid_number);
            auto next = kids.getArrayItem(kid_number);
            if (!next.isIndirect()) {
                if (impl.auto_repair) {
                    QTC::TC("qpdf", "NNTree fix indirect kid");
                    warn(
                        impl.qpdf,
                        node,
                        ("converting kid number " + std::to_string(kid_number) +
                         " to an indirect object"));
                    next = impl.qpdf.makeIndirectObject(next);
                    kids.setArrayItem(kid_number, next);
                } else {
                    QTC::TC("qpdf", "NNTree warn indirect kid");
                    warn(
                        impl.qpdf,
                        node,
                        ("kid number " + std::to_string(kid_number) +
                         " is not an indirect object"));
                }
            }
            node = next;
        } else if (allow_empty && items.isArray()) {
            QTC::TC("qpdf", "NNTree deepen found empty");
            setItemNumber(node, -1);
            break;
        } else {
            QTC::TC("qpdf", "NNTree deepen: invalid node");
            warn(
                impl.qpdf,
                node,
                ("name/number tree node has neither non-empty " + impl.details.itemsKey() +
                 " nor /Kids"));
            failed = true;
            break;
        }
    }
    if (failed) {
        this->path = opath;
        return false;
    }
    return true;
}